

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_div(DisasContext_conflict1 *s,arg_rrr *a,_Bool u)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 retval;
  TCGv_i32 arg2;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool u_local;
  arg_rrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    _Var1 = isar_feature_aa32_arm_div(s->isar);
    if (_Var1) goto LAB_007a7cf1;
  }
  else {
    _Var1 = isar_feature_aa32_thumb_div(s->isar);
    if (_Var1) {
LAB_007a7cf1:
      retval = load_reg(s,a->rn);
      arg2 = load_reg(s,a->rm);
      if (u) {
        gen_helper_udiv(tcg_ctx_00,retval,retval,arg2);
      }
      else {
        gen_helper_sdiv(tcg_ctx_00,retval,retval,arg2);
      }
      tcg_temp_free_i32(tcg_ctx_00,arg2);
      store_reg(s,a->rd,retval);
      return true;
    }
  }
  return false;
}

Assistant:

static bool op_div(DisasContext *s, arg_rrr *a, bool u)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (s->thumb
        ? !dc_isar_feature(aa32_thumb_div, s)
        : !dc_isar_feature(aa32_arm_div, s)) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    if (u) {
        gen_helper_udiv(tcg_ctx, t1, t1, t2);
    } else {
        gen_helper_sdiv(tcg_ctx, t1, t1, t2);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}